

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

GLchar * __thiscall
gl4cts::EnhancedLayouts::VaryingLocationAliasingWithMixedInterpolationTest::
getInterpolationQualifier
          (VaryingLocationAliasingWithMixedInterpolationTest *this,INTERPOLATIONS interpolation)

{
  TestError *this_00;
  char *local_20;
  GLchar *result;
  INTERPOLATIONS interpolation_local;
  VaryingLocationAliasingWithMixedInterpolationTest *this_local;
  
  if (interpolation == SMOOTH) {
    local_20 = "smooth";
  }
  else if (interpolation == FLAT) {
    local_20 = "flat";
  }
  else {
    if (interpolation != NO_PERSPECTIVE) {
      this_00 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (this_00,"Invalid enum",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cEnhancedLayoutsTests.cpp"
                 ,0x47c6);
      __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
    local_20 = "noperspective";
  }
  return local_20;
}

Assistant:

const GLchar* VaryingLocationAliasingWithMixedInterpolationTest::getInterpolationQualifier(INTERPOLATIONS interpolation)
{
	const GLchar* result = 0;

	switch (interpolation)
	{
	case SMOOTH:
		result = "smooth";
		break;
	case FLAT:
		result = "flat";
		break;
	case NO_PERSPECTIVE:
		result = "noperspective";
		break;
	default:
		TCU_FAIL("Invalid enum");
	}

	return result;
}